

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>
pbrt::PathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Tuple_impl<0UL,_pbrt::PathIntegrator_*,_std::default_delete<pbrt::PathIntegrator>_> _Var2;
  bool regularize;
  PathIntegrator *this;
  string lightStrategy;
  string local_a0;
  Float local_80;
  int local_7c;
  string local_78;
  _Tuple_impl<0UL,_pbrt::PathIntegrator_*,_std::default_delete<pbrt::PathIntegrator>_> local_58;
  PrimitiveHandle *local_50;
  SamplerHandle *local_48;
  PrimitiveHandle local_40;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_38;
  
  paVar1 = &lightStrategy.field_2;
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  local_48 = sampler;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"maxdepth","");
  local_7c = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&lightStrategy,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  lightStrategy._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lightStrategy,"rrthreshold","");
  local_80 = ParameterDictionary::GetOneFloat((ParameterDictionary *)camera,&lightStrategy,1.0);
  local_58.super__Head_base<0UL,_pbrt::PathIntegrator_*,_false>._M_head_impl =
       (_Head_base<0UL,_pbrt::PathIntegrator_*,_false>)
       (_Head_base<0UL,_pbrt::PathIntegrator_*,_false>)parameters;
  local_50 = aggregate;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != paVar1) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"lightsampler","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bvh","");
  ParameterDictionary::GetOneString
            (&lightStrategy,(ParameterDictionary *)camera,&local_a0,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"regularize","");
  regularize = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  this = (PathIntegrator *)operator_new(0x80);
  local_78._M_dataplus._M_p =
       (pointer)(local_48->
                super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
  local_38.bits =
       (local_50->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  local_40.
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           )(lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_a0,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)loc);
  PathIntegrator(this,local_7c,(CameraHandle *)&local_78,(SamplerHandle *)&local_38,&local_40,
                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_a0,local_80
                 ,&lightStrategy,regularize);
  _Var2.super__Head_base<0UL,_pbrt::PathIntegrator_*,_false>._M_head_impl =
       local_58.super__Head_base<0UL,_pbrt::PathIntegrator_*,_false>._M_head_impl;
  *(PathIntegrator **)local_58.super__Head_base<0UL,_pbrt::PathIntegrator_*,_false>._M_head_impl =
       this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_a0._M_dataplus._M_p,
                    local_a0.field_2._M_allocated_capacity - (long)local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lightStrategy._M_dataplus._M_p != &lightStrategy.field_2) {
    operator_delete(lightStrategy._M_dataplus._M_p,lightStrategy.field_2._M_allocated_capacity + 1);
  }
  return (unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>)
         _Var2.super__Head_base<0UL,_pbrt::PathIntegrator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<PathIntegrator> PathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    Float rrThreshold = parameters.GetOneFloat("rrthreshold", 1.);
    std::string lightStrategy = parameters.GetOneString("lightsampler", "bvh");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<PathIntegrator>(maxDepth, camera, sampler, aggregate, lights,
                                            rrThreshold, lightStrategy, regularize);
}